

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# bitwise.c
# Opt level: O3

long oggpack_read(oggpack_buffer *b,int bits)

{
  int iVar1;
  ulong uVar2;
  long lVar3;
  byte *pbVar4;
  long lVar5;
  byte bVar6;
  uint uVar7;
  uint uVar8;
  ulong uVar9;
  
  if ((uint)bits < 0x21) {
    uVar2 = mask[(uint)bits];
    iVar1 = b->endbit;
    uVar8 = bits + iVar1;
    lVar3 = b->endbyte;
    lVar5 = b->storage;
    if (lVar5 + -4 <= lVar3) {
      if (lVar5 - ((int)(uVar8 + 7) >> 3) < lVar3) goto LAB_001e4c25;
      if (uVar8 == 0) {
        return 0;
      }
    }
    pbVar4 = b->ptr;
    bVar6 = (byte)iVar1;
    uVar9 = (ulong)(*pbVar4 >> (bVar6 & 0x1f));
    if ((((8 < (int)uVar8) &&
         (uVar9 = (long)(int)((uint)pbVar4[1] << (8 - bVar6 & 0x1f)) | uVar9, 0x10 < uVar8)) &&
        (uVar9 = uVar9 | (long)(int)((uint)pbVar4[2] << (0x10 - bVar6 & 0x1f)), 0x18 < uVar8)) &&
       (uVar9 = uVar9 | (long)(int)((uint)pbVar4[3] << (0x18 - bVar6 & 0x1f)),
       iVar1 != 0 && 0x20 < uVar8)) {
      uVar9 = uVar9 | (long)(int)((uint)pbVar4[4] << (-bVar6 & 0x1f));
    }
    uVar7 = uVar8 + 7;
    if (-1 < (int)uVar8) {
      uVar7 = uVar8;
    }
    b->ptr = pbVar4 + ((int)uVar7 >> 3);
    b->endbyte = lVar3 + ((int)uVar7 >> 3);
    b->endbit = uVar8 & 7;
    return uVar9 & uVar2;
  }
  lVar5 = b->storage;
LAB_001e4c25:
  b->ptr = (uchar *)0x0;
  b->endbyte = lVar5;
  b->endbit = 1;
  return -1;
}

Assistant:

long oggpack_read(oggpack_buffer *b,int bits){
  long ret;
  unsigned long m;

  if(bits<0 || bits>32) goto err;
  m=mask[bits];
  bits+=b->endbit;

  if(b->endbyte >= b->storage-4){
    /* not the main path */
    if(b->endbyte > b->storage-((bits+7)>>3)) goto overflow;
    /* special case to avoid reading b->ptr[0], which might be past the end of
        the buffer; also skips some useless accounting */
    else if(!bits)return(0L);
  }

  ret=b->ptr[0]>>b->endbit;
  if(bits>8){
    ret|=b->ptr[1]<<(8-b->endbit);
    if(bits>16){
      ret|=b->ptr[2]<<(16-b->endbit);
      if(bits>24){
        ret|=b->ptr[3]<<(24-b->endbit);
        if(bits>32 && b->endbit){
          ret|=b->ptr[4]<<(32-b->endbit);
        }
      }
    }
  }
  ret&=m;
  b->ptr+=bits/8;
  b->endbyte+=bits/8;
  b->endbit=bits&7;
  return ret;

 overflow:
 err:
  b->ptr=NULL;
  b->endbyte=b->storage;
  b->endbit=1;
  return -1L;
}